

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack4.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_transform_input_pack4_sse
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  undefined1 (*pauVar30) [16];
  long lVar31;
  ulong uVar32;
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float tmp [8] [8] [4];
  long local_4f0;
  long local_4e8;
  float afStack_438 [4];
  undefined1 auStack_428 [16];
  undefined1 auStack_418 [16];
  undefined1 auStack_408 [16];
  undefined1 auStack_3f8 [16];
  undefined1 auStack_3e8 [16];
  undefined1 auStack_3d8 [16];
  undefined1 auStack_3c8 [16];
  float afStack_3b8 [64];
  float afStack_2b8 [64];
  float afStack_1b8 [64];
  float afStack_b8 [34];
  
  iVar4 = bottom_blob->c;
  if (0 < (long)iVar4) {
    iVar5 = bottom_blob->w;
    iVar6 = bottom_blob->h;
    uVar21 = (iVar6 + -2) / 6;
    uVar22 = (iVar5 + -2) / 6;
    iVar23 = uVar21 * uVar22;
    uVar32 = 1;
    if (1 < (int)uVar22) {
      uVar32 = (ulong)uVar22;
    }
    if ((int)uVar21 < 2) {
      uVar21 = 1;
    }
    local_4f0 = 0;
    auVar33 = ZEXT1664(CONCAT412(0xc0880000,CONCAT48(0xc0880000,0xc0880000c0880000)));
    auVar39 = ZEXT1664(CONCAT412(0xbfa00000,CONCAT48(0xbfa00000,0xbfa00000bfa00000)));
    do {
      if (7 < iVar6) {
        iVar7 = bottom_blob->w;
        sVar8 = bottom_blob->elemsize;
        lVar29 = (long)bottom_blob->data + sVar8 * bottom_blob->cstep * local_4f0 + 0x70;
        lVar28 = bottom_blob_tm->elemsize * bottom_blob_tm->cstep * local_4f0;
        pvVar9 = bottom_blob_tm->data;
        local_4e8 = 0;
        uVar27 = 0;
        do {
          if (7 < iVar5) {
            uVar26 = 0;
            lVar25 = local_4e8;
            do {
              pauVar30 = (undefined1 (*) [16])(((long)((uVar26 << 0x23) * 3) >> 0x1e) + lVar29);
              lVar24 = -0x80;
              do {
                auVar3 = pauVar30[-6];
                auVar40 = pauVar30[-5];
                auVar47 = pauVar30[-4];
                auVar53 = pauVar30[-3];
                auVar62 = pauVar30[-2];
                auVar52 = pauVar30[-1];
                auVar63 = vsubps_avx(auVar53,auVar40);
                auVar18 = vsubps_avx(pauVar30[-7],auVar52);
                auVar19 = vsubps_avx(auVar47,auVar62);
                auVar20 = vsubps_avx(*pauVar30,auVar3);
                *(float *)((long)afStack_3b8 + lVar24) = auVar18._0_4_ + auVar63._0_4_ * 5.25;
                *(float *)((long)afStack_3b8 + lVar24 + 4) = auVar18._4_4_ + auVar63._4_4_ * 5.25;
                *(float *)((long)afStack_3b8 + lVar24 + 8) = auVar18._8_4_ + auVar63._8_4_ * 5.25;
                *(float *)((long)afStack_3b8 + lVar24 + 0xc) =
                     auVar18._12_4_ + auVar63._12_4_ * 5.25;
                *(float *)((long)afStack_b8 + lVar24 + 0x80) = auVar20._0_4_ + auVar19._0_4_ * 5.25;
                *(float *)((long)afStack_b8 + lVar24 + 0x84) = auVar20._4_4_ + auVar19._4_4_ * 5.25;
                *(float *)(&stack0xffffffffffffffd0 + lVar24) = auVar20._8_4_ + auVar19._8_4_ * 5.25
                ;
                *(float *)(&stack0xffffffffffffffd4 + lVar24) =
                     auVar20._12_4_ + auVar19._12_4_ * 5.25;
                fVar10 = auVar52._0_4_;
                fVar46 = auVar40._0_4_;
                fVar12 = auVar52._4_4_;
                fVar49 = auVar40._4_4_;
                fVar14 = auVar52._8_4_;
                fVar50 = auVar40._8_4_;
                fVar16 = auVar52._12_4_;
                fVar51 = auVar40._12_4_;
                auVar52._0_4_ = auVar53._0_4_ * auVar33._0_4_ + fVar46 + fVar10;
                auVar52._4_4_ = auVar53._4_4_ * auVar33._4_4_ + fVar49 + fVar12;
                auVar52._8_4_ = auVar53._8_4_ * auVar33._8_4_ + fVar50 + fVar14;
                auVar52._12_4_ = auVar53._12_4_ * auVar33._12_4_ + fVar51 + fVar16;
                fVar11 = auVar3._0_4_;
                fVar42 = auVar62._0_4_;
                fVar13 = auVar3._4_4_;
                fVar43 = auVar62._4_4_;
                fVar15 = auVar3._8_4_;
                fVar44 = auVar62._8_4_;
                fVar17 = auVar3._12_4_;
                fVar45 = auVar62._12_4_;
                auVar62._0_4_ = auVar47._0_4_ * auVar33._0_4_ + fVar42 + fVar11;
                auVar62._4_4_ = auVar47._4_4_ * auVar33._4_4_ + fVar43 + fVar13;
                auVar62._8_4_ = auVar47._8_4_ * auVar33._8_4_ + fVar44 + fVar15;
                auVar62._12_4_ = auVar47._12_4_ * auVar33._12_4_ + fVar45 + fVar17;
                auVar3 = vsubps_avx(auVar52,auVar62);
                *(float *)((long)afStack_3b8 + lVar24 + 0x80) = auVar52._0_4_ + auVar62._0_4_;
                *(float *)((long)afStack_3b8 + lVar24 + 0x84) = auVar52._4_4_ + auVar62._4_4_;
                *(float *)((long)afStack_3b8 + lVar24 + 0x88) = auVar52._8_4_ + auVar62._8_4_;
                *(float *)((long)afStack_3b8 + lVar24 + 0x8c) = auVar52._12_4_ + auVar62._12_4_;
                *(undefined1 (*) [16])((long)afStack_2b8 + lVar24) = auVar3;
                fVar58 = auVar53._0_4_ * auVar39._0_4_;
                fVar59 = auVar53._4_4_ * auVar39._4_4_;
                fVar60 = auVar53._8_4_ * auVar39._8_4_;
                fVar61 = auVar53._12_4_ * auVar39._12_4_;
                auVar53._0_4_ = fVar58 + fVar46 * 0.25 + fVar10;
                auVar53._4_4_ = fVar59 + fVar49 * 0.25 + fVar12;
                auVar53._8_4_ = fVar60 + fVar50 * 0.25 + fVar14;
                auVar53._12_4_ = fVar61 + fVar51 * 0.25 + fVar16;
                fVar54 = auVar47._0_4_ * -2.5;
                fVar55 = auVar47._4_4_ * -2.5;
                fVar56 = auVar47._8_4_ * -2.5;
                fVar57 = auVar47._12_4_ * -2.5;
                auVar63._0_4_ = fVar54 + fVar11 * 0.5 + fVar42 + fVar42;
                auVar63._4_4_ = fVar55 + fVar13 * 0.5 + fVar43 + fVar43;
                auVar63._8_4_ = fVar56 + fVar15 * 0.5 + fVar44 + fVar44;
                auVar63._12_4_ = fVar57 + fVar17 * 0.5 + fVar45 + fVar45;
                auVar3 = vsubps_avx(auVar53,auVar63);
                *(float *)((long)afStack_2b8 + lVar24 + 0x80) = auVar53._0_4_ + auVar63._0_4_;
                *(float *)((long)afStack_2b8 + lVar24 + 0x84) = auVar53._4_4_ + auVar63._4_4_;
                *(float *)((long)afStack_2b8 + lVar24 + 0x88) = auVar53._8_4_ + auVar63._8_4_;
                *(float *)((long)afStack_2b8 + lVar24 + 0x8c) = auVar53._12_4_ + auVar63._12_4_;
                *(undefined1 (*) [16])((long)afStack_1b8 + lVar24) = auVar3;
                auVar47._0_4_ = (fVar58 + fVar46) * 4.0 + fVar10;
                auVar47._4_4_ = (fVar59 + fVar49) * 4.0 + fVar12;
                auVar47._8_4_ = (fVar60 + fVar50) * 4.0 + fVar14;
                auVar47._12_4_ = (fVar61 + fVar51) * 4.0 + fVar16;
                auVar40._0_4_ = fVar42 * 0.5 + fVar54 + fVar11 + fVar11;
                auVar40._4_4_ = fVar43 * 0.5 + fVar55 + fVar13 + fVar13;
                auVar40._8_4_ = fVar44 * 0.5 + fVar56 + fVar15 + fVar15;
                auVar40._12_4_ = fVar45 * 0.5 + fVar57 + fVar17 + fVar17;
                auVar3 = vsubps_avx(auVar47,auVar40);
                *(float *)((long)afStack_1b8 + lVar24 + 0x80) = auVar47._0_4_ + auVar40._0_4_;
                *(float *)((long)afStack_1b8 + lVar24 + 0x84) = auVar47._4_4_ + auVar40._4_4_;
                *(float *)((long)afStack_1b8 + lVar24 + 0x88) = auVar47._8_4_ + auVar40._8_4_;
                *(float *)((long)afStack_1b8 + lVar24 + 0x8c) = auVar47._12_4_ + auVar40._12_4_;
                *(undefined1 (*) [16])((long)afStack_b8 + lVar24) = auVar3;
                pauVar30 = (undefined1 (*) [16])(*pauVar30 + (long)(iVar5 * 4) * 4);
                lVar24 = lVar24 + 0x10;
              } while (lVar24 != 0);
              lVar31 = 0;
              lVar24 = lVar25;
              do {
                auVar3 = *(undefined1 (*) [16])(auStack_428 + lVar31);
                auVar40 = *(undefined1 (*) [16])(auStack_418 + lVar31);
                auVar47 = *(undefined1 (*) [16])(auStack_408 + lVar31);
                auVar53 = *(undefined1 (*) [16])(auStack_3f8 + lVar31);
                auVar62 = *(undefined1 (*) [16])(auStack_3e8 + lVar31);
                auVar52 = *(undefined1 (*) [16])(auStack_3d8 + lVar31);
                auVar63 = vsubps_avx(auVar53,auVar40);
                auVar18 = vsubps_avx(*(undefined1 (*) [16])((long)afStack_438 + lVar31),auVar52);
                auVar19 = vsubps_avx(auVar47,auVar62);
                auVar20 = vsubps_avx(*(undefined1 (*) [16])(auStack_3c8 + lVar31),auVar3);
                fVar10 = auVar52._0_4_;
                fVar46 = auVar40._0_4_;
                fVar12 = auVar52._4_4_;
                fVar49 = auVar40._4_4_;
                fVar14 = auVar52._8_4_;
                fVar50 = auVar40._8_4_;
                fVar16 = auVar52._12_4_;
                fVar51 = auVar40._12_4_;
                auVar34._0_4_ = auVar53._0_4_ * auVar33._0_4_ + fVar46 + fVar10;
                auVar34._4_4_ = auVar53._4_4_ * auVar33._4_4_ + fVar49 + fVar12;
                auVar34._8_4_ = auVar53._8_4_ * auVar33._8_4_ + fVar50 + fVar14;
                auVar34._12_4_ = auVar53._12_4_ * auVar33._12_4_ + fVar51 + fVar16;
                fVar11 = auVar3._0_4_;
                fVar42 = auVar62._0_4_;
                fVar13 = auVar3._4_4_;
                fVar43 = auVar62._4_4_;
                fVar15 = auVar3._8_4_;
                fVar44 = auVar62._8_4_;
                fVar17 = auVar3._12_4_;
                fVar45 = auVar62._12_4_;
                auVar35._0_4_ = auVar47._0_4_ * auVar33._0_4_ + fVar42 + fVar11;
                auVar35._4_4_ = auVar47._4_4_ * auVar33._4_4_ + fVar43 + fVar13;
                auVar35._8_4_ = auVar47._8_4_ * auVar33._8_4_ + fVar44 + fVar15;
                auVar35._12_4_ = auVar47._12_4_ * auVar33._12_4_ + fVar45 + fVar17;
                auVar3 = vsubps_avx(auVar34,auVar35);
                fVar58 = auVar53._0_4_ * auVar39._0_4_;
                fVar59 = auVar53._4_4_ * auVar39._4_4_;
                fVar60 = auVar53._8_4_ * auVar39._8_4_;
                fVar61 = auVar53._12_4_ * auVar39._12_4_;
                auVar36._0_4_ = fVar10 + fVar58 + fVar46 * 0.25;
                auVar36._4_4_ = fVar12 + fVar59 + fVar49 * 0.25;
                auVar36._8_4_ = fVar14 + fVar60 + fVar50 * 0.25;
                auVar36._12_4_ = fVar16 + fVar61 + fVar51 * 0.25;
                fVar54 = auVar47._0_4_ * -2.5;
                fVar55 = auVar47._4_4_ * -2.5;
                fVar56 = auVar47._8_4_ * -2.5;
                fVar57 = auVar47._12_4_ * -2.5;
                auVar37._0_4_ = fVar54 + fVar11 * 0.5 + fVar42 + fVar42;
                auVar37._4_4_ = fVar55 + fVar13 * 0.5 + fVar43 + fVar43;
                auVar37._8_4_ = fVar56 + fVar15 * 0.5 + fVar44 + fVar44;
                auVar37._12_4_ = fVar57 + fVar17 * 0.5 + fVar45 + fVar45;
                auVar40 = vsubps_avx(auVar36,auVar37);
                auVar38._0_4_ = fVar10 + (fVar58 + fVar46) * 4.0;
                auVar38._4_4_ = fVar12 + (fVar59 + fVar49) * 4.0;
                auVar38._8_4_ = fVar14 + (fVar60 + fVar50) * 4.0;
                auVar38._12_4_ = fVar16 + (fVar61 + fVar51) * 4.0;
                auVar41._0_4_ = fVar42 * 0.5 + fVar54 + fVar11 + fVar11;
                auVar41._4_4_ = fVar43 * 0.5 + fVar55 + fVar13 + fVar13;
                auVar41._8_4_ = fVar44 * 0.5 + fVar56 + fVar15 + fVar15;
                auVar41._12_4_ = fVar45 * 0.5 + fVar57 + fVar17 + fVar17;
                auVar48._0_4_ = auVar38._0_4_ + auVar41._0_4_;
                auVar48._4_4_ = auVar38._4_4_ + auVar41._4_4_;
                auVar48._8_4_ = auVar38._8_4_ + auVar41._8_4_;
                auVar48._12_4_ = auVar38._12_4_ + auVar41._12_4_;
                auVar47 = vsubps_avx(auVar38,auVar41);
                puVar1 = (undefined8 *)((long)pvVar9 + lVar24 + lVar28);
                *puVar1 = CONCAT44(auVar18._4_4_ + auVar63._4_4_ * 5.25,
                                   auVar18._0_4_ + auVar63._0_4_ * 5.25);
                puVar1[1] = CONCAT44(auVar18._12_4_ + auVar63._12_4_ * 5.25,
                                     auVar18._8_4_ + auVar63._8_4_ * 5.25);
                pfVar2 = (float *)((long)pvVar9 + lVar24 + (long)(iVar23 * 4) * 4 + lVar28);
                *pfVar2 = auVar34._0_4_ + auVar35._0_4_;
                pfVar2[1] = auVar34._4_4_ + auVar35._4_4_;
                pfVar2[2] = auVar34._8_4_ + auVar35._8_4_;
                pfVar2[3] = auVar34._12_4_ + auVar35._12_4_;
                *(undefined1 (*) [16])((long)pvVar9 + lVar24 + (long)(iVar23 * 8) * 4 + lVar28) =
                     auVar3;
                pfVar2 = (float *)((long)pvVar9 + lVar24 + (long)(iVar23 * 0xc) * 4 + lVar28);
                *pfVar2 = auVar36._0_4_ + auVar37._0_4_;
                pfVar2[1] = auVar36._4_4_ + auVar37._4_4_;
                pfVar2[2] = auVar36._8_4_ + auVar37._8_4_;
                pfVar2[3] = auVar36._12_4_ + auVar37._12_4_;
                *(undefined1 (*) [16])((long)pvVar9 + lVar24 + (long)(iVar23 * 0x10) * 4 + lVar28) =
                     auVar40;
                *(undefined1 (*) [16])((long)pvVar9 + lVar24 + (long)(iVar23 * 0x14) * 4 + lVar28) =
                     auVar48;
                *(undefined1 (*) [16])((long)pvVar9 + lVar24 + (long)(iVar23 * 0x18) * 4 + lVar28) =
                     auVar47;
                auVar33 = ZEXT1664(auVar33._0_16_);
                auVar39 = ZEXT1664(auVar39._0_16_);
                puVar1 = (undefined8 *)((long)pvVar9 + lVar24 + (long)(iVar23 * 0x1c) * 4 + lVar28);
                *puVar1 = CONCAT44(auVar20._4_4_ + auVar19._4_4_ * 5.25,
                                   auVar20._0_4_ + auVar19._0_4_ * 5.25);
                puVar1[1] = CONCAT44(auVar20._12_4_ + auVar19._12_4_ * 5.25,
                                     auVar20._8_4_ + auVar19._8_4_ * 5.25);
                lVar31 = lVar31 + 0x80;
                lVar24 = lVar24 + (long)(iVar23 * 0x20) * 4;
              } while (lVar31 != 0x400);
              uVar26 = uVar26 + 1;
              lVar25 = lVar25 + 0x10;
            } while (uVar26 != uVar32);
          }
          uVar27 = uVar27 + 1;
          lVar29 = lVar29 + (long)iVar7 * sVar8 * 6;
          local_4e8 = local_4e8 + (long)(int)uVar22 * 0x10;
        } while (uVar27 != uVar21);
      }
      local_4f0 = local_4f0 + 1;
    } while (local_4f0 != iVar4);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_input_pack4_sse(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 6;
    const int h_tiles = (h - 2) / 6;
    const int tiles = w_tiles * h_tiles;

    // const float itm[8][8] = {
    //     {1.0f,  0.0f, -5.25f,  0.00f,  5.25f,  0.00f, -1.0f, 0.0f},
    //
    //     {0.0f,  1.0f,  1.00f, -4.25f, -4.25f,  1.00f,  1.0f, 0.0f},
    //     {0.0f, -1.0f,  1.00f,  4.25f, -4.25f, -1.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  0.5f,  0.25f, -2.50f, -1.25f,  2.00f,  1.0f, 0.0f},
    //     {0.0f, -0.5f,  0.25f,  2.50f, -1.25f, -2.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  2.0f,  4.00f, -2.50f, -5.00f,  0.50f,  1.0f, 0.0f},
    //     {0.0f, -2.0f,  4.00f,  2.50f, -5.00f, -0.50f,  1.0f, 0.0f},
    //
    //     {0.0f, -1.0f,  0.00f,  5.25f,  0.00f, -5.25f,  0.0f, 1.0f}
    // };

    // 0 = r00 - r06 + (r04 - r02) * 5.25
    // 7 = r07 - r01 + (r03 - r05) * 5.25

    // 1 = (r02 + r06 - r04 * 4.25) + (r01 - r03 * 4.25 + r05)
    // 2 = (r02 + r06 - r04 * 4.25) - (r01 - r03 * 4.25 + r05)

    // 3 = (r06 + r02 * 0.25 - r04 * 1.25) + (r01 * 0.5 - r03 * 2.5 + r05 * 2)
    // 4 = (r06 + r02 * 0.25 - r04 * 1.25) - (r01 * 0.5 - r03 * 2.5 + r05 * 2)

    // reuse r04 * 1.25
    // reuse r03 * 2.5
    // 5 = (r06 + (r02 - r04 * 1.25) * 4) + (r01 * 2 - r03 * 2.5 + r05 * 0.5)
    // 6 = (r06 + (r02 - r04 * 1.25) * 4) - (r01 * 2 - r03 * 2.5 + r05 * 0.5)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(16))
#else
        __attribute__((aligned(16)))
#endif
        float tmp[8][8][4];

        __m128 _v5_25 = _mm_set1_ps(5.25f);
        __m128 _vm4_25 = _mm_set1_ps(-4.25f);
        __m128 _vm1_25 = _mm_set1_ps(-1.25f);
        __m128 _v0_25 = _mm_set1_ps(0.25f);
        __m128 _vm2_5 = _mm_set1_ps(-2.5f);
        __m128 _v0_5 = _mm_set1_ps(0.5f);
        __m128 _v2 = _mm_set1_ps(2.f);
        __m128 _v4 = _mm_set1_ps(4.f);

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 6) + (j * 6) * 4;

                for (int m = 0; m < 8; m++)
                {
                    __m128 _r00 = _mm_load_ps(r0);
                    __m128 _r01 = _mm_load_ps(r0 + 4);
                    __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                    __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                    __m128 _r04 = _mm_load_ps(r0 + 4 * 4);
                    __m128 _r05 = _mm_load_ps(r0 + 4 * 5);
                    __m128 _r06 = _mm_load_ps(r0 + 4 * 6);
                    __m128 _r07 = _mm_load_ps(r0 + 4 * 7);

                    __m128 _tmp0m = _mm_comp_fmadd_ps(_v5_25, _mm_sub_ps(_r04, _r02), _mm_sub_ps(_r00, _r06));
                    __m128 _tmp7m = _mm_comp_fmadd_ps(_v5_25, _mm_sub_ps(_r03, _r05), _mm_sub_ps(_r07, _r01));
                    _mm_store_ps(tmp[0][m], _tmp0m);
                    _mm_store_ps(tmp[7][m], _tmp7m);

                    __m128 _tmp12a = _mm_comp_fmadd_ps(_vm4_25, _r04, _mm_add_ps(_r02, _r06));
                    __m128 _tmp12b = _mm_comp_fmadd_ps(_vm4_25, _r03, _mm_add_ps(_r01, _r05));

                    __m128 _tmp1m = _mm_add_ps(_tmp12a, _tmp12b);
                    __m128 _tmp2m = _mm_sub_ps(_tmp12a, _tmp12b);
                    _mm_store_ps(tmp[1][m], _tmp1m);
                    _mm_store_ps(tmp[2][m], _tmp2m);

                    __m128 _tmp34a = _mm_comp_fmadd_ps(_vm1_25, _r04, _mm_comp_fmadd_ps(_v0_25, _r02, _r06));
                    __m128 _tmp34b = _mm_comp_fmadd_ps(_v2, _r05, _mm_comp_fmadd_ps(_vm2_5, _r03, _mm_mul_ps(_r01, _v0_5)));

                    __m128 _tmp3m = _mm_add_ps(_tmp34a, _tmp34b);
                    __m128 _tmp4m = _mm_sub_ps(_tmp34a, _tmp34b);
                    _mm_store_ps(tmp[3][m], _tmp3m);
                    _mm_store_ps(tmp[4][m], _tmp4m);

                    __m128 _tmp56a = _mm_comp_fmadd_ps(_v4, _mm_comp_fmadd_ps(_vm1_25, _r04, _r02), _r06);
                    __m128 _tmp56b = _mm_comp_fmadd_ps(_v0_5, _r05, _mm_comp_fmadd_ps(_vm2_5, _r03, _mm_mul_ps(_r01, _v2)));

                    __m128 _tmp5m = _mm_add_ps(_tmp56a, _tmp56b);
                    __m128 _tmp6m = _mm_sub_ps(_tmp56a, _tmp56b);
                    _mm_store_ps(tmp[5][m], _tmp5m);
                    _mm_store_ps(tmp[6][m], _tmp6m);

                    r0 += w * 4;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 4;
                float* r0_tm_1 = r0_tm_0 + tiles * 4;
                float* r0_tm_2 = r0_tm_0 + tiles * 4 * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 4 * 3;
                float* r0_tm_4 = r0_tm_0 + tiles * 4 * 4;
                float* r0_tm_5 = r0_tm_0 + tiles * 4 * 5;
                float* r0_tm_6 = r0_tm_0 + tiles * 4 * 6;
                float* r0_tm_7 = r0_tm_0 + tiles * 4 * 7;

                for (int m = 0; m < 8; m++)
                {
                    __m128 _tmp00 = _mm_load_ps(tmp[m][0]);
                    __m128 _tmp01 = _mm_load_ps(tmp[m][1]);
                    __m128 _tmp02 = _mm_load_ps(tmp[m][2]);
                    __m128 _tmp03 = _mm_load_ps(tmp[m][3]);
                    __m128 _tmp04 = _mm_load_ps(tmp[m][4]);
                    __m128 _tmp05 = _mm_load_ps(tmp[m][5]);
                    __m128 _tmp06 = _mm_load_ps(tmp[m][6]);
                    __m128 _tmp07 = _mm_load_ps(tmp[m][7]);

                    __m128 _r0tm0 = _mm_comp_fmadd_ps(_v5_25, _mm_sub_ps(_tmp04, _tmp02), _mm_sub_ps(_tmp00, _tmp06));
                    __m128 _r0tm7 = _mm_comp_fmadd_ps(_v5_25, _mm_sub_ps(_tmp03, _tmp05), _mm_sub_ps(_tmp07, _tmp01));

                    __m128 _tmp12a = _mm_comp_fmadd_ps(_vm4_25, _tmp04, _mm_add_ps(_tmp02, _tmp06));
                    __m128 _tmp12b = _mm_comp_fmadd_ps(_vm4_25, _tmp03, _mm_add_ps(_tmp01, _tmp05));

                    __m128 _r0tm1 = _mm_add_ps(_tmp12a, _tmp12b);
                    __m128 _r0tm2 = _mm_sub_ps(_tmp12a, _tmp12b);

                    __m128 _tmp34a = _mm_comp_fmadd_ps(_vm1_25, _tmp04, _mm_comp_fmadd_ps(_v0_25, _tmp02, _tmp06));
                    __m128 _tmp34b = _mm_comp_fmadd_ps(_v2, _tmp05, _mm_comp_fmadd_ps(_vm2_5, _tmp03, _mm_mul_ps(_tmp01, _v0_5)));

                    __m128 _r0tm3 = _mm_add_ps(_tmp34a, _tmp34b);
                    __m128 _r0tm4 = _mm_sub_ps(_tmp34a, _tmp34b);

                    __m128 _tmp56a = _mm_comp_fmadd_ps(_v4, _mm_comp_fmadd_ps(_vm1_25, _tmp04, _tmp02), _tmp06);
                    __m128 _tmp56b = _mm_comp_fmadd_ps(_v0_5, _tmp05, _mm_comp_fmadd_ps(_vm2_5, _tmp03, _mm_mul_ps(_tmp01, _v2)));

                    __m128 _r0tm5 = _mm_add_ps(_tmp56a, _tmp56b);
                    __m128 _r0tm6 = _mm_sub_ps(_tmp56a, _tmp56b);

                    _mm_store_ps(r0_tm_0, _r0tm0);
                    _mm_store_ps(r0_tm_1, _r0tm1);
                    _mm_store_ps(r0_tm_2, _r0tm2);
                    _mm_store_ps(r0_tm_3, _r0tm3);
                    _mm_store_ps(r0_tm_4, _r0tm4);
                    _mm_store_ps(r0_tm_5, _r0tm5);
                    _mm_store_ps(r0_tm_6, _r0tm6);
                    _mm_store_ps(r0_tm_7, _r0tm7);

                    r0_tm_0 += tiles * 4 * 8;
                    r0_tm_1 += tiles * 4 * 8;
                    r0_tm_2 += tiles * 4 * 8;
                    r0_tm_3 += tiles * 4 * 8;
                    r0_tm_4 += tiles * 4 * 8;
                    r0_tm_5 += tiles * 4 * 8;
                    r0_tm_6 += tiles * 4 * 8;
                    r0_tm_7 += tiles * 4 * 8;
                }
            }
        }
    }
}